

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_0::deviceFeatures(TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *poVar1;
  ostringstream *this;
  TestLog *pTVar2;
  bool bVar3;
  InstanceInterface *pIVar4;
  VkPhysicalDevice pVVar5;
  long lVar6;
  deUint8 buffer [252];
  QueryMemberTableEntry featureOffsetTable [56];
  undefined1 local_7b8 [16];
  TestLog local_7a8 [13];
  ios_base local_740 [264];
  VkPhysicalDeviceFeatures local_638;
  char acStack_55c [36];
  undefined1 local_538 [384];
  QueryMemberTableEntry local_3b8 [56];
  
  pTVar2 = context->m_testCtx->m_log;
  memcpy(local_3b8,&DAT_00ad1eb0,0x380);
  memset(&local_638,0xcd,0xfc);
  pIVar4 = Context::getInstanceInterface(context);
  pVVar5 = Context::getPhysicalDevice(context);
  (*pIVar4->_vptr_InstanceInterface[2])(pIVar4,pVVar5,&local_638);
  this = (ostringstream *)(local_538 + 8);
  local_538._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"device = ",9);
  Context::getPhysicalDevice(context);
  std::ostream::_M_insert<void_const*>(this);
  local_7b8._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_538,(EndMessageToken *)&tcu::TestLog::EndMessage);
  poVar1 = (ostringstream *)(local_7b8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  ::vk::operator<<((ostream *)poVar1,&local_638);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_7b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_740);
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base((ios_base *)(local_538 + 0x78));
  if (local_638.robustBufferAccess == 0) {
    local_7b8._0_8_ = local_7a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7b8,"robustBufferAccess is not supported","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_7b8._0_8_,
               (long)(qpTestLog **)local_7b8._0_8_ + local_7b8._8_8_);
  }
  else if ((local_638.multiViewport == 0) || (local_638.geometryShader != 0)) {
    lVar6 = 0;
    do {
      if (acStack_55c[lVar6] != -0x33) {
        poVar1 = (ostringstream *)(local_7b8 + 8);
        local_7b8._0_8_ = pTVar2;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"deviceFeatures - Guard offset ",0x1e);
        std::ostream::operator<<(poVar1,(int)lVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," not valid",10);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_7b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_740);
        local_7b8._0_8_ = local_7a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_7b8,"deviceFeatures buffer overflow","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,local_7b8._0_8_,
                   (long)(qpTestLog **)local_7b8._0_8_ + local_7b8._8_8_);
        goto LAB_0043d9b5;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x20);
    pVVar5 = Context::getPhysicalDevice(context);
    pIVar4 = Context::getInstanceInterface(context);
    bVar3 = ::vk::ValidateQueryBits::
            validateInitComplete<vk::VkPhysicalDevice_s*,vk::InstanceInterface,vk::VkPhysicalDeviceFeatures>
                      ((ValidateQueryBits *)pVVar5,(VkPhysicalDevice_s *)0x11,0,pIVar4,local_3b8);
    if (bVar3) {
      local_7b8._0_8_ = local_7a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7b8,"Query succeeded","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_7b8._0_8_,
                 (long)(qpTestLog **)local_7b8._0_8_ + local_7b8._8_8_);
    }
    else {
      poVar1 = (ostringstream *)(local_7b8 + 8);
      local_7b8._0_8_ = pTVar2;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "deviceFeatures - VkPhysicalDeviceFeatures not completely initialized",0x44);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_7b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_740);
      local_7b8._0_8_ = local_7a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_7b8,"deviceFeatures incomplete initialization","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_7b8._0_8_,
                 (long)(qpTestLog **)local_7b8._0_8_ + local_7b8._8_8_);
    }
  }
  else {
    local_7b8._0_8_ = local_7a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7b8,"multiViewport is supported but geometryShader is not","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_7b8._0_8_,
               (long)(qpTestLog **)local_7b8._0_8_ + local_7b8._8_8_);
  }
LAB_0043d9b5:
  if ((TestLog *)local_7b8._0_8_ != local_7a8) {
    operator_delete((void *)local_7b8._0_8_,(ulong)((long)&(local_7a8[0].m_log)->flags + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus deviceFeatures (Context& context)
{
	using namespace ValidateQueryBits;

	TestLog&						log			= context.getTestContext().getLog();
	VkPhysicalDeviceFeatures*		features;
	deUint8							buffer[sizeof(VkPhysicalDeviceFeatures) + GUARD_SIZE];

	const QueryMemberTableEntry featureOffsetTable[] =
	{
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, robustBufferAccess),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, fullDrawIndexUint32),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, imageCubeArray),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, independentBlend),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, geometryShader),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, tessellationShader),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sampleRateShading),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, dualSrcBlend),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, logicOp),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, multiDrawIndirect),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, drawIndirectFirstInstance),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, depthClamp),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, depthBiasClamp),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, fillModeNonSolid),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, depthBounds),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, wideLines),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, largePoints),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, alphaToOne),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, multiViewport),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, samplerAnisotropy),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, textureCompressionETC2),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, textureCompressionASTC_LDR),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, textureCompressionBC),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, occlusionQueryPrecise),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, pipelineStatisticsQuery),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, vertexPipelineStoresAndAtomics),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, fragmentStoresAndAtomics),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderTessellationAndGeometryPointSize),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderImageGatherExtended),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderStorageImageExtendedFormats),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderStorageImageMultisample),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderStorageImageReadWithoutFormat),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderStorageImageWriteWithoutFormat),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderUniformBufferArrayDynamicIndexing),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderSampledImageArrayDynamicIndexing),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderStorageBufferArrayDynamicIndexing),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderStorageImageArrayDynamicIndexing),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderClipDistance),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderCullDistance),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderFloat64),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderInt64),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderInt16),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderResourceResidency),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, shaderResourceMinLod),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseBinding),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseResidencyBuffer),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseResidencyImage2D),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseResidencyImage3D),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseResidency2Samples),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseResidency4Samples),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseResidency8Samples),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseResidency16Samples),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, sparseResidencyAliased),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, variableMultisampleRate),
		OFFSET_TABLE_ENTRY(VkPhysicalDeviceFeatures, inheritedQueries),
		{ 0, 0 }
	};

	deMemset(buffer, GUARD_VALUE, sizeof(buffer));
	features = reinterpret_cast<VkPhysicalDeviceFeatures*>(buffer);

	context.getInstanceInterface().getPhysicalDeviceFeatures(context.getPhysicalDevice(), features);

	log << TestLog::Message << "device = " << context.getPhysicalDevice() << TestLog::EndMessage
		<< TestLog::Message << *features << TestLog::EndMessage;

	// Requirements and dependencies
	{
		if (!features->robustBufferAccess)
			return tcu::TestStatus::fail("robustBufferAccess is not supported");

		// multiViewport requires MultiViewport (SPIR-V capability) support, which depends on Geometry
		if (features->multiViewport && !features->geometryShader)
			return tcu::TestStatus::fail("multiViewport is supported but geometryShader is not");
	}

	for (int ndx = 0; ndx < GUARD_SIZE; ndx++)
	{
		if (buffer[ndx + sizeof(VkPhysicalDeviceFeatures)] != GUARD_VALUE)
		{
			log << TestLog::Message << "deviceFeatures - Guard offset " << ndx << " not valid" << TestLog::EndMessage;
			return tcu::TestStatus::fail("deviceFeatures buffer overflow");
		}
	}

	if (!validateInitComplete(context.getPhysicalDevice(), &InstanceInterface::getPhysicalDeviceFeatures, context.getInstanceInterface(), featureOffsetTable))
	{
		log << TestLog::Message << "deviceFeatures - VkPhysicalDeviceFeatures not completely initialized" << TestLog::EndMessage;
		return tcu::TestStatus::fail("deviceFeatures incomplete initialization");
	}

	return tcu::TestStatus::pass("Query succeeded");
}